

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.cpp
# Opt level: O0

void * crnlib::MyAlloc(size_t size)

{
  size_t size_local;
  
  if (size == 0) {
    size_local = 0;
  }
  else {
    size_local = (size_t)malloc(size);
  }
  return (void *)size_local;
}

Assistant:

void* MyAlloc(size_t size) {
  if (size == 0)
    return 0;
#ifdef _SZ_ALLOC_DEBUG
  {
    void* p = crnlib::crnlib_malloc(size);
    fprintf(stderr, "\nAlloc %10d bytes, count = %10d,  addr = %8X", size, g_allocCount++, (unsigned)p);
    return p;
  }
#else
  return malloc(size);
#endif
}